

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O0

void compute_plotting_region(Instance *instance,double *llx,double *lly,double *w,double *h)

{
  Vec2d *pVVar1;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  Vec2d *pos;
  double dStack_58;
  int32_t i;
  double max_y;
  double min_y;
  double max_x;
  double min_x;
  int32_t n;
  double *h_local;
  double *w_local;
  double *lly_local;
  double *llx_local;
  Instance *instance_local;
  
  max_x = 9999999.0;
  min_y = -9999999.0;
  max_y = 99999999.0;
  dStack_58 = -9999999.0;
  for (pos._4_4_ = 0; pos._4_4_ < instance->num_customers + 1; pos._4_4_ = pos._4_4_ + 1) {
    pVVar1 = instance->positions + pos._4_4_;
    if (max_x <= pVVar1->x) {
      local_70 = max_x;
    }
    else {
      local_70 = pVVar1->x;
    }
    max_x = local_70;
    if (min_y <= pVVar1->x) {
      local_78 = pVVar1->x;
    }
    else {
      local_78 = min_y;
    }
    min_y = local_78;
    if (max_y <= pVVar1->x) {
      local_80 = max_y;
    }
    else {
      local_80 = pVVar1->x;
    }
    max_y = local_80;
    if (dStack_58 <= pVVar1->x) {
      local_88 = pVVar1->x;
    }
    else {
      local_88 = dStack_58;
    }
    dStack_58 = local_88;
  }
  *llx = max_x;
  *lly = max_y;
  *w = min_y - max_x;
  *h = dStack_58 - max_y;
  return;
}

Assistant:

static void compute_plotting_region(const Instance *instance, double *llx,
                                    double *lly, double *w, double *h) {

    int32_t n = instance->num_customers + 1;

    double min_x = 9999999, max_x = -9999999;
    double min_y = 99999999, max_y = -9999999;

    for (int32_t i = 0; i < n; i++) {
        const Vec2d *pos = &instance->positions[i];

        min_x = MIN(pos->x, min_x);
        max_x = MAX(pos->x, max_x);

        min_y = MIN(pos->x, min_y);
        max_y = MAX(pos->x, max_y);
    }

    *llx = min_x;
    *lly = min_y;
    *w = max_x - min_x;
    *h = max_y - min_y;
}